

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdVerifyConfidentialTxSignature
              (void *handle,char *tx_hex,char *signature,char *pubkey,char *script,char *txid,
              uint32_t vout,int sighash_type,bool sighash_anyone_can_pay,int64_t value_satoshi,
              char *value_commitment,int witness_version)

{
  pointer *ppuVar1;
  SigHashType sighash_type_00;
  bool bVar2;
  CfdException *pCVar3;
  int iVar4;
  _func_int **pp_Var5;
  Amount AVar6;
  undefined4 uVar7;
  WitnessVersion version;
  allocator local_1a2;
  allocator local_1a1;
  Script local_1a0;
  void *local_168;
  undefined1 local_160 [16];
  _func_int *local_150 [2];
  ConfidentialValue value;
  ConfidentialTransactionController ctxc;
  SigHashType sighash_type_obj;
  Txid txid_obj;
  ByteData signature_obj;
  string local_80;
  Pubkey local_60;
  SigHashType local_48;
  SigHashType local_3c;
  
  local_168 = handle;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tx_hex);
  if (bVar2) {
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x5f3c92;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0x839;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_c17f04;
    cfd::core::logger::log<>((CfdSourceLocation *)&ctxc,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&ctxc.transaction_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&ctxc,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(signature);
  if (bVar2) {
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x5f3c92;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0x83f;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_c17f04;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&ctxc,kCfdLogLevelWarning,"signature is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&ctxc.transaction_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&ctxc,"Failed to parameter. signature is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(pubkey);
  if (bVar2) {
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)0x5f3c92;
    ctxc.super_AbstractTransactionController.tx_address_._0_4_ = 0x845;
    ctxc.transaction_.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)anon_var_dwarf_c17f04;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&ctxc,kCfdLogLevelWarning,"pubkey is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
         (_func_int **)&ctxc.transaction_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&ctxc,"Failed to parameter. pubkey is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&ctxc);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::__cxx11::string::string((string *)&local_1a0,tx_hex,(allocator *)&value);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&ctxc,(string *)&local_1a0);
  ppuVar1 = (pointer *)
            ((long)&local_1a0.script_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data + 8);
  if (local_1a0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_1a0._vptr_Script);
  }
  std::__cxx11::string::string((string *)&local_1a0,signature,(allocator *)&value);
  cfd::core::ByteData::ByteData(&signature_obj,(string *)&local_1a0);
  if (local_1a0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_1a0._vptr_Script);
  }
  std::__cxx11::string::string((string *)&local_1a0,txid,(allocator *)&value);
  cfd::core::Txid::Txid(&txid_obj,(string *)&local_1a0);
  if (local_1a0._vptr_Script != (_func_int **)ppuVar1) {
    operator_delete(local_1a0._vptr_Script);
  }
  cfd::core::SigHashType::Create
            (&sighash_type_obj,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  cfd::core::ConfidentialValue::ConfidentialValue(&value);
  bVar2 = cfd::capi::IsEmptyString(value_commitment);
  if (bVar2) {
    AVar6 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
    local_160._0_8_ = AVar6.amount_;
    local_160[8] = AVar6.ignore_check_;
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&local_1a0,(Amount *)local_160);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&local_1a0);
    local_1a0._vptr_Script = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if ((_func_int **)
        local_1a0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
LAB_0040389d:
      operator_delete(local_1a0.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__cxx11::string::string((string *)local_160,value_commitment,(allocator *)&local_80);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&local_1a0,(string *)local_160);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&local_1a0);
    local_1a0._vptr_Script = (_func_int **)&PTR__ConfidentialValue_007357f0;
    if ((_func_int **)
        local_1a0.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_1a0.script_data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1a0.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_160._0_8_;
    if ((_func_int **)local_160._0_8_ != local_150) goto LAB_0040389d;
  }
  bVar2 = cfd::capi::IsEmptyString(script);
  if (bVar2) {
    bVar2 = cfd::capi::IsEmptyString(pubkey);
    if (bVar2) {
      bVar2 = false;
      goto LAB_00403a4b;
    }
    std::__cxx11::string::string((string *)&local_1a0,pubkey,(allocator *)&local_80);
    cfd::core::Pubkey::Pubkey((Pubkey *)local_160,(string *)&local_1a0);
    cfd::core::SigHashType::SigHashType(&local_48,&sighash_type_obj);
    bVar2 = cfd::ConfidentialTransactionController::VerifyInputSignature
                      (&ctxc,&signature_obj,(Pubkey *)local_160,&txid_obj,vout,&local_48,&value,
                       witness_version);
    if ((_func_int **)local_160._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_160._0_8_);
    }
    pp_Var5 = local_1a0._vptr_Script;
    if (local_1a0._vptr_Script == (_func_int **)ppuVar1) goto LAB_00403a4b;
  }
  else {
    std::__cxx11::string::string((string *)local_160,pubkey,&local_1a1);
    cfd::core::Pubkey::Pubkey(&local_60,(string *)local_160);
    std::__cxx11::string::string((string *)&local_80,script,&local_1a2);
    cfd::core::Script::Script(&local_1a0,&local_80);
    version = 0x403937;
    cfd::core::SigHashType::SigHashType(&local_3c,&sighash_type_obj);
    uVar7 = SUB84(&value,0);
    sighash_type_00.is_anyone_can_pay_ = (bool)(char)uVar7;
    sighash_type_00.is_fork_id_ = (bool)(char)((uint)uVar7 >> 8);
    sighash_type_00._10_2_ = (short)((uint)uVar7 >> 0x10);
    sighash_type_00._0_8_ = &local_3c;
    bVar2 = cfd::ConfidentialTransactionController::VerifyInputSignature
                      (&ctxc,&signature_obj,&local_60,&txid_obj,vout,&local_1a0,sighash_type_00,
                       (ConfidentialValue *)(ulong)(uint)witness_version,version);
    cfd::core::Script::~Script(&local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pp_Var5 = (_func_int **)local_160._0_8_;
    if ((_func_int **)local_160._0_8_ == local_150) goto LAB_00403a4b;
  }
  operator_delete(pp_Var5);
LAB_00403a4b:
  iVar4 = 7;
  if (bVar2 != false) {
    iVar4 = 0;
  }
  value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
  if (value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(value.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  txid_obj._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (txid_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(txid_obj.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (signature_obj.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(signature_obj.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ctxc.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_00735388;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&ctxc.transaction_);
  return iVar4;
}

Assistant:

CFDC_API int CfdVerifyConfidentialTxSignature(
    void* handle, const char* tx_hex, const char* signature,
    const char* pubkey, const char* script, const char* txid, uint32_t vout,
    int sighash_type, bool sighash_anyone_can_pay, int64_t value_satoshi,
    const char* value_commitment, int witness_version) {
  bool work_result = false;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    if (IsEmptyString(pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }

    ConfidentialTransactionController ctxc(tx_hex);
    ByteData signature_obj(signature);
    Txid txid_obj(txid);
    SigHashType sighash_type_obj = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    ConfidentialValue value;
    if (!IsEmptyString(value_commitment)) {
      value = ConfidentialValue(value_commitment);
    } else {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    }

    if (!IsEmptyString(script)) {
      work_result = ctxc.VerifyInputSignature(
          signature_obj, Pubkey(pubkey), txid_obj, vout, Script(script),
          sighash_type_obj, value,
          static_cast<WitnessVersion>(witness_version));
    } else if (!IsEmptyString(pubkey)) {
      work_result = ctxc.VerifyInputSignature(
          signature_obj, Pubkey(pubkey), txid_obj, vout, sighash_type_obj,
          value, static_cast<WitnessVersion>(witness_version));
    }

    if (!work_result) {
      return CfdErrorCode::kCfdSignVerificationError;
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}